

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

string * __thiscall CodeGen::unionName_abi_cxx11_(CodeGen *this)

{
  unsigned_long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type n;
  string s;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  long local_38;
  string local_30 [48];
  
  s_00 = in_RDI;
  std::__cxx11::string::string(local_30,(string *)(in_RSI + 7));
  local_38 = std::__cxx11::string::find_last_of((char *)local_30,0x22f4ec);
  if (local_38 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_30);
    std::__cxx11::string::operator=(local_30,local_58);
    std::__cxx11::string::~string(local_58);
  }
  __rhs = local_30;
  makeCanonical(s_00,SUB81((ulong)in_RDI >> 0x38,0));
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  *in_RSI = *in_RSI + 1;
  boost::lexical_cast<std::__cxx11::string,unsigned_long>(in_RSI);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::operator+(in_RDI,(char *)__rhs);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_30);
  return s_00;
}

Assistant:

string CodeGen::unionName()
{
    string s = schemaFile_;
    string::size_type n = s.find_last_of("/\\");
    if (n != string::npos) {
        s = s.substr(n);
    }
    makeCanonical(s, false);

    return s + "_Union__" + boost::lexical_cast<string>(unionNumber_++) + "__";
}